

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O2

bool s_try_send<NetAction>(socket_t *socket,NetAction *value,int flags)

{
  bool bVar1;
  string_view payload;
  string msg;
  
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&msg);
  memcpy(msg._M_dataplus._M_p,value,msg._M_string_length);
  payload._M_str = msg._M_dataplus._M_p;
  payload._M_len = msg._M_string_length;
  bVar1 = s_send_raw(socket,payload,flags);
  std::__cxx11::string::~string((string *)&msg);
  return bVar1;
}

Assistant:

bool s_try_send(zmq::socket_t *socket, const T &value, int flags = 0) {
    static_assert(is_transferable<T>::value, "Cannot transfer this type");
    std::string msg;
    msg.resize(sizeof(T));
    ::memcpy(msg.data(), &value, msg.size());

    return s_send_raw(socket, std::string_view(msg), flags);
}